

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_expression.cpp
# Opt level: O1

string * __thiscall
duckdb::LambdaExpression::ToString_abi_cxx11_(string *__return_storage_ptr__,LambdaExpression *this)

{
  undefined8 *puVar1;
  long lVar2;
  pointer pPVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->lhs);
  (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])(local_40);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x1e4c92c);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_50 = *plVar6;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar6;
    local_60 = (long *)*plVar4;
  }
  local_58 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_60);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_90 = *puVar7;
    lStack_88 = plVar4[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar7;
    local_a0 = (ulong *)*plVar4;
  }
  local_98 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->expr);
  (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])(&local_80,pPVar3);
  uVar9 = 0xf;
  if (local_a0 != &local_90) {
    uVar9 = local_90;
  }
  if (uVar9 < (ulong)(local_78 + local_98)) {
    uVar9 = 0xf;
    if (local_80 != local_70) {
      uVar9 = local_70[0];
    }
    if ((ulong)(local_78 + local_98) <= uVar9) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0124df70;
    }
  }
  puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
LAB_0124df70:
  local_c0 = &local_b0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_b0 = *puVar1;
    uStack_a8 = puVar5[3];
  }
  else {
    local_b0 = *puVar1;
    local_c0 = (undefined8 *)*puVar5;
  }
  local_b8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_c0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string LambdaExpression::ToString() const {
	return "(" + lhs->ToString() + " -> " + expr->ToString() + ")";
}